

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O1

void av1_write_tx_type(AV1_COMMON *cm,MACROBLOCKD *xd,TX_TYPE tx_type,TX_SIZE tx_size,aom_writer *w)

{
  _Bool _Var1;
  uint8_t uVar2;
  ushort uVar3;
  ushort uVar4;
  int iVar5;
  MB_MODE_INFO *pMVar6;
  short sVar7;
  PREDICTION_MODE *pPVar8;
  byte bVar9;
  byte bVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  aom_cdf_prob *icdf;
  
  pMVar6 = *xd->mi;
  uVar3 = *(ushort *)&pMVar6->field_0xa7;
  uVar12 = 1;
  if (-1 < (char)uVar3) {
    uVar12 = (ulong)('\0' < pMVar6->ref_frame[0]);
  }
  _Var1 = (cm->features).reduced_tx_set_used;
  uVar13 = (ulong)tx_size;
  uVar14 = 0x61810L >> (tx_size & 0x3f);
  iVar11 = (int)uVar12;
  bVar9 = (byte)uVar12;
  if ((0x61810UL >> (uVar13 & 0x3f) & 1) == 0) {
    bVar10 = bVar9;
    if (((0x18608UL >> (uVar13 & 0x3f) & 1) == 0) && (bVar10 = 1, _Var1 == false)) {
      bVar10 = av1_ext_tx_set_lookup[0]
               [(ulong)((0x60604UL >> (uVar13 & 0x3f) & 1) != 0) + (ulong)(uint)(iVar11 * 2)];
    }
  }
  else {
    bVar10 = 0;
  }
  if (bVar10 != 0) {
    uVar2 = (cm->seg).enabled;
    if (uVar2 == '\0') {
      iVar5 = (cm->quant_params).base_qindex;
    }
    else {
      iVar5 = xd->qindex[uVar3 & 7];
    }
    if (((0 < iVar5) && (pMVar6->skip_txfm == '\0')) &&
       ((uVar2 == '\0' || (((cm->seg).feature_mask[uVar3 & 7] & 0x40) == 0)))) {
      if ((uVar14 & 1) == 0) {
        uVar15 = uVar12;
        if ((0x18608UL >> (uVar13 & 0x3f) & 1) == 0) {
          if (_Var1 == false) {
            uVar15 = (ulong)av1_ext_tx_set_lookup[0]
                            [(ulong)((0x60604UL >> (uVar13 & 0x3f) & 1) != 0) +
                             (ulong)(uint)(iVar11 * 2)];
          }
          else {
            uVar15 = (ulong)(byte)((iVar11 == 0) + 1);
          }
        }
      }
      else {
        uVar15 = 0;
      }
      bVar10 = ""[uVar13];
      if ((uVar14 & 1) == 0) {
        if ((0x18608UL >> (uVar13 & 0x3f) & 1) == 0) {
          if (_Var1 == false) {
            bVar9 = av1_ext_tx_set_lookup[0]
                    [(ulong)((0x60604UL >> (uVar13 & 0x3f) & 1) != 0) + (ulong)(uint)(iVar11 * 2)];
          }
          else {
            bVar9 = (iVar11 == 0) + 1;
          }
        }
      }
      else {
        bVar9 = 0;
      }
      if (iVar11 == 0) {
        if ((pMVar6->filter_intra_mode_info).use_filter_intra == '\0') {
          pPVar8 = &pMVar6->mode;
        }
        else {
          pPVar8 = "" + (pMVar6->filter_intra_mode_info).filter_intra_mode;
        }
        aom_write_symbol(w,*(int *)((long)av1_ext_tx_ind[0] +
                                   (ulong)tx_type * 4 + (ulong)(uint)((int)uVar15 << 6)),
                         xd->tile_ctx->intra_ext_tx_cdf[ext_tx_set_index[uVar12][bVar9]][bVar10][0]
                         + (ulong)*pPVar8 + (ulong)*pPVar8 * 0x10,av1_num_ext_tx_set[uVar15]);
        return;
      }
      iVar11 = av1_num_ext_tx_set[uVar15];
      iVar5 = *(int *)((long)av1_ext_tx_ind[0] +
                      (ulong)tx_type * 4 + (ulong)(uint)((int)uVar15 << 6));
      icdf = xd->tile_ctx->inter_ext_tx_cdf[ext_tx_set_index[uVar12][bVar9]][0] +
             (ulong)bVar10 + (ulong)bVar10 * 0x10;
      od_ec_encode_cdf_q15(&w->ec,iVar5,icdf,iVar11);
      if (w->allow_update_cdf != '\0') {
        uVar3 = icdf[iVar11];
        bVar9 = ((char)(uVar3 >> 4) - ((byte)uVar15 < 2)) + 5;
        uVar12 = 1;
        if (1 < (int)(iVar11 - 1U)) {
          uVar12 = (ulong)(iVar11 - 1U);
        }
        uVar13 = 0;
        do {
          uVar4 = icdf[uVar13];
          if ((long)uVar13 < (long)(char)iVar5) {
            sVar7 = (short)((int)(0x8000 - (uint)uVar4) >> (bVar9 & 0x1f));
          }
          else {
            sVar7 = -(uVar4 >> (bVar9 & 0x1f));
          }
          icdf[uVar13] = sVar7 + uVar4;
          uVar13 = uVar13 + 1;
        } while (uVar12 != uVar13);
        icdf[iVar11] = icdf[iVar11] + (ushort)(uVar3 < 0x20);
      }
    }
  }
  return;
}

Assistant:

void av1_write_tx_type(const AV1_COMMON *const cm, const MACROBLOCKD *xd,
                       TX_TYPE tx_type, TX_SIZE tx_size, aom_writer *w) {
  MB_MODE_INFO *mbmi = xd->mi[0];
  const FeatureFlags *const features = &cm->features;
  const int is_inter = is_inter_block(mbmi);
  if (get_ext_tx_types(tx_size, is_inter, features->reduced_tx_set_used) > 1 &&
      ((!cm->seg.enabled && cm->quant_params.base_qindex > 0) ||
       (cm->seg.enabled && xd->qindex[mbmi->segment_id] > 0)) &&
      !mbmi->skip_txfm &&
      !segfeature_active(&cm->seg, mbmi->segment_id, SEG_LVL_SKIP)) {
    FRAME_CONTEXT *ec_ctx = xd->tile_ctx;
    const TX_SIZE square_tx_size = txsize_sqr_map[tx_size];
    const TxSetType tx_set_type = av1_get_ext_tx_set_type(
        tx_size, is_inter, features->reduced_tx_set_used);
    const int eset =
        get_ext_tx_set(tx_size, is_inter, features->reduced_tx_set_used);
    // eset == 0 should correspond to a set with only DCT_DCT and there
    // is no need to send the tx_type
    assert(eset > 0);
    assert(av1_ext_tx_used[tx_set_type][tx_type]);
    if (is_inter) {
      aom_write_symbol(w, av1_ext_tx_ind[tx_set_type][tx_type],
                       ec_ctx->inter_ext_tx_cdf[eset][square_tx_size],
                       av1_num_ext_tx_set[tx_set_type]);
    } else {
      PREDICTION_MODE intra_dir;
      if (mbmi->filter_intra_mode_info.use_filter_intra)
        intra_dir =
            fimode_to_intradir[mbmi->filter_intra_mode_info.filter_intra_mode];
      else
        intra_dir = mbmi->mode;
      aom_write_symbol(
          w, av1_ext_tx_ind[tx_set_type][tx_type],
          ec_ctx->intra_ext_tx_cdf[eset][square_tx_size][intra_dir],
          av1_num_ext_tx_set[tx_set_type]);
    }
  }
}